

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
vkt::ssbo::anon_unknown_15::computeBufferSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ShaderInterface *interface,
          BufferLayout *layout)

{
  int iVar1;
  _Alloc_hider __s;
  pointer pBVar2;
  int *piVar3;
  pointer pBVar4;
  uint uVar5;
  int iVar6;
  pointer ppBVar7;
  long *plVar8;
  undefined8 *puVar9;
  int *piVar10;
  long *plVar11;
  size_type *psVar12;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  string apiName;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  BufferBlock *local_228;
  long *local_220;
  undefined8 local_218;
  long local_210;
  undefined8 uStack_208;
  string local_200;
  ShaderInterface *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  allocator_type local_1a8 [112];
  ios_base local_138 [264];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,local_1a8);
  ppBVar7 = (interface->m_bufferBlocks).
            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(interface->m_bufferBlocks).
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar7) >> 3)) {
    local_1d8 = 0;
    local_1e0 = interface;
    do {
      local_228 = ppBVar7[local_1d8];
      uVar5 = local_228->m_arraySize;
      if (local_228->m_arraySize < 2) {
        uVar5 = 1;
      }
      local_1d0 = (ulong)uVar5;
      uVar14 = 0;
      do {
        __s._M_p = (local_228->m_blockName)._M_dataplus._M_p;
        iVar15 = local_228->m_arraySize;
        if (iVar15 < 1) {
          puVar13 = &local_218;
          plVar8 = &local_210;
          local_220 = &local_210;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb561c0);
          local_248 = &local_238;
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            local_238 = *plVar11;
            lStack_230 = plVar8[3];
          }
          else {
            local_238 = *plVar11;
            local_248 = (long *)*plVar8;
          }
          local_240 = plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
          plVar8 = puVar9 + 2;
          if ((long *)*puVar9 == plVar8) {
            local_210 = *plVar8;
            uStack_208 = puVar9[3];
            local_220 = &local_210;
          }
          else {
            local_210 = *plVar8;
            local_220 = (long *)*puVar9;
          }
          puVar13 = puVar9 + 1;
          local_218 = puVar9[1];
          *puVar9 = plVar8;
        }
        *puVar13 = 0;
        *(undefined1 *)plVar8 = 0;
        strlen(__s._M_p);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_220,0,(char *)0x0,(ulong)__s._M_p);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_200.field_2._M_allocated_capacity = *psVar12;
          local_200.field_2._8_8_ = plVar8[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar12;
          local_200._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_200._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (0 < iVar15) {
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
        }
        uVar5 = BufferLayout::getBlockIndex(layout,&local_200);
        if (-1 < (int)uVar5) {
          pBVar2 = (layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar10 = *(int **)&pBVar2[uVar5].activeVarIndices.
                              super__Vector_base<int,_std::allocator<int>_>;
          piVar3 = *(pointer *)
                    ((long)&pBVar2[uVar5].activeVarIndices.
                            super__Vector_base<int,_std::allocator<int>_> + 8);
          bVar16 = piVar10 != piVar3;
          if (bVar16) {
            pBVar4 = (layout->bufferVars).
                     super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar16 = true;
            if ((pBVar4[*piVar10].arraySize != 0) && (pBVar4[*piVar10].topLevelArraySize != 0)) {
              while( true ) {
                piVar10 = piVar10 + 1;
                bVar16 = piVar10 != piVar3;
                if (piVar10 == piVar3) break;
                if ((pBVar4[*piVar10].arraySize == 0) || (pBVar4[*piVar10].topLevelArraySize == 0))
                break;
              }
            }
          }
          iVar6 = 0;
          iVar15 = 0;
          if (bVar16) {
            iVar15 = *(int *)(*(long *)&(local_228->m_lastUnsizedArraySizes).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data + uVar14 * 4);
          }
          iVar1 = pBVar2[uVar5].size;
          if (bVar16) {
            iVar6 = getUnsizedArrayStride(layout,pBVar2 + uVar5);
          }
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5] = iVar6 * iVar15 + iVar1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_1d0);
      local_1d8 = local_1d8 + 1;
      ppBVar7 = (local_1e0->m_bufferBlocks).
                super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_1d8 <
             (int)((ulong)((long)(local_1e0->m_bufferBlocks).
                                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar7) >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> computeBufferSizes (const ShaderInterface& interface, const BufferLayout& layout)
{
	vector<int> sizes(layout.blocks.size());

	for (int declNdx = 0; declNdx < interface.getNumBlocks(); declNdx++)
	{
		const BufferBlock&	block			= interface.getBlock(declNdx);
		const bool			isArray			= block.isArray();
		const int			numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			const string	apiName		= getBlockAPIName(block, instanceNdx);
			const int		blockNdx	= layout.getBlockIndex(apiName);

			if (blockNdx >= 0)
			{
				const BlockLayoutEntry&		blockLayout		= layout.blocks[blockNdx];
				const int					baseSize		= blockLayout.size;
				const bool					isLastUnsized	= hasUnsizedArray(layout, blockLayout);
				const int					lastArraySize	= isLastUnsized ? block.getLastUnsizedArraySize(instanceNdx) : 0;
				const int					stride			= isLastUnsized ? getUnsizedArrayStride(layout, blockLayout) : 0;

				sizes[blockNdx] = baseSize + lastArraySize*stride;
			}
		}
	}

	return sizes;
}